

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::rotate(btSoftBody *this,btQuaternion *rot)

{
  btQuaternion *in_RDI;
  btTransform t;
  btTransform *in_stack_ffffffffffffffb0;
  btTransform *in_stack_ffffffffffffffc0;
  
  btTransform::btTransform(in_stack_ffffffffffffffb0);
  btTransform::setIdentity(in_stack_ffffffffffffffc0);
  btTransform::setRotation(in_stack_ffffffffffffffb0,in_RDI);
  transform((btSoftBody *)t.m_origin.m_floats._8_8_,(btTransform *)t.m_origin.m_floats._0_8_);
  return;
}

Assistant:

void			btSoftBody::rotate(	const btQuaternion& rot)
{
	btTransform	t;
	t.setIdentity();
	t.setRotation(rot);
	transform(t);
}